

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QHybrid.cpp
# Opt level: O1

void __thiscall QHybrid::Initialize(QHybrid *this)

{
  long lVar1;
  pointer pdVar2;
  size_type sVar3;
  long *plVar4;
  long lVar5;
  PlanningUnitMADPDiscrete *pPVar6;
  size_t sVar7;
  size_t sVar8;
  ulong uVar9;
  size_type sVar10;
  double *pdVar11;
  ostream *poVar12;
  E *this_00;
  size_t sVar13;
  size_type __n;
  Index ts;
  ulong uVar14;
  Index agentI;
  long *local_50;
  long local_48;
  long local_40 [2];
  
  if (this->_m_QlastTimeSteps == (QFunctionJointBeliefInterface *)0x0) {
    this_00 = (E *)__cxa_allocate_exception(0x28);
    E::E(this_00,"QHybrid::Initialize QlastTimeSteps should be valid");
  }
  else {
    if (this->_m_QheurTypeFirstTS - eQPOMDP < 2) {
      uVar14 = 0;
      if (this->_m_horizonFirstTimeSteps == 0) {
        sVar13 = 0;
      }
      else {
        sVar13 = 0;
        do {
          lVar5 = *(long *)((long)this->super_QFunctionJAOHInterface + -0x88);
          plVar4 = (long *)(**(code **)(*(long *)(&(this->super_QFunctionJAOHInterface).field_0x0 +
                                                 lVar5) + 0x60))
                                     (&(this->super_QFunctionJAOHInterface).field_0x0 + lVar5);
          lVar5 = (**(code **)(*plVar4 + 0x30))(plVar4);
          ts = (Index)uVar14;
          if (lVar5 == 0) {
            lVar5 = 1;
          }
          else {
            lVar5 = 1;
            uVar14 = 0;
            do {
              lVar1 = *(long *)((long)this->super_QFunctionJAOHInterface + -0x88);
              pPVar6 = (PlanningUnitMADPDiscrete *)
                       (**(code **)(*(long *)(&(this->super_QFunctionJAOHInterface).field_0x0 +
                                             lVar1) + 0x60))
                                 (&(this->super_QFunctionJAOHInterface).field_0x0 + lVar1);
              agentI = (Index)uVar14;
              sVar7 = PlanningUnitMADPDiscrete::GetNrObservationHistories(pPVar6,agentI,ts);
              lVar1 = *(long *)((long)this->super_QFunctionJAOHInterface + -0x88);
              pPVar6 = (PlanningUnitMADPDiscrete *)
                       (**(code **)(*(long *)(&(this->super_QFunctionJAOHInterface).field_0x0 +
                                             lVar1) + 0x60))
                                 (&(this->super_QFunctionJAOHInterface).field_0x0 + lVar1);
              sVar8 = PlanningUnitMADPDiscrete::GetNrActionHistories(pPVar6,agentI,ts);
              lVar5 = sVar7 * lVar5 * sVar8;
              uVar14 = (ulong)(agentI + 1);
              lVar1 = *(long *)((long)this->super_QFunctionJAOHInterface + -0x88);
              plVar4 = (long *)(**(code **)(*(long *)(&(this->super_QFunctionJAOHInterface).
                                                       field_0x0 + lVar1) + 0x60))
                                         (&(this->super_QFunctionJAOHInterface).field_0x0 + lVar1);
              uVar9 = (**(code **)(*plVar4 + 0x30))(plVar4);
            } while (uVar14 < uVar9);
          }
          sVar13 = sVar13 + lVar5;
          uVar14 = (ulong)(ts + 1);
        } while (uVar14 < this->_m_horizonFirstTimeSteps);
      }
      this->_m_nrJAOHinFirstTS = sVar13;
      lVar5 = *(long *)((long)this->super_QFunctionJAOHInterface + -0x88);
      lVar5 = (**(code **)(*(long *)(&(this->super_QFunctionJAOHInterface).field_0x0 + lVar5) + 0x60
                          ))(&(this->super_QFunctionJAOHInterface).field_0x0 + lVar5);
      sVar10 = (**(code **)(**(long **)(lVar5 + 0x30) + 0x68))();
      __n = sVar10 * sVar13;
      if ((this->_m_QValuesFirstTimeSteps).super_matrix_t.data_.size_ != __n) {
        pdVar2 = (this->_m_QValuesFirstTimeSteps).super_matrix_t.data_.data_;
        if (__n != 0) {
          pdVar11 = __gnu_cxx::new_allocator<double>::allocate
                              ((new_allocator<double> *)
                               &(this->_m_QValuesFirstTimeSteps).super_matrix_t.data_,__n,
                               (void *)0x0);
          (this->_m_QValuesFirstTimeSteps).super_matrix_t.data_.data_ = pdVar11;
        }
        sVar3 = (this->_m_QValuesFirstTimeSteps).super_matrix_t.data_.size_;
        if (sVar3 != 0) {
          operator_delete(pdVar2,sVar3 << 3);
        }
        if (__n == 0) {
          (this->_m_QValuesFirstTimeSteps).super_matrix_t.data_.data_ = (pointer)0x0;
        }
        (this->_m_QValuesFirstTimeSteps).super_matrix_t.data_.size_ = __n;
      }
      (this->_m_QValuesFirstTimeSteps).super_matrix_t.size1_ = sVar13;
      (this->_m_QValuesFirstTimeSteps).super_matrix_t.size2_ = sVar10;
      QTable::SetToZero(&this->_m_QValuesFirstTimeSteps);
      this->_m_initialized = true;
      (**(code **)((long)this->super_QFunctionJAOHInterface + 0x48))(&local_50,this);
      poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,(char *)local_50,local_48);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12," with ",6);
      poVar12 = std::ostream::_M_insert<unsigned_long>((ulong)poVar12);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12," JAOH in tree (",0xf);
      poVar12 = std::ostream::_M_insert<unsigned_long>((ulong)poVar12);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12," ts), and",9);
      if (local_50 != local_40) {
        operator_delete(local_50,local_40[0] + 1);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," vectors for ",0xd);
      poVar12 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12," ts.",4);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar12 + -0x18) + (char)poVar12);
      std::ostream::put((char)poVar12);
      std::ostream::flush();
      return;
    }
    this_00 = (E *)__cxa_allocate_exception(0x28);
    E::E(this_00,"QHybrid can only use QBG or QPOMDP for the first time steps");
  }
  __cxa_throw(this_00,&E::typeinfo,E::~E);
}

Assistant:

void QHybrid::Initialize()
{
#if 1 // now we can handle this case -> not working completely yet...
    if(!_m_QlastTimeSteps)
        throw(E("QHybrid::Initialize QlastTimeSteps should be valid"));
#endif

    if(!(_m_QheurTypeFirstTS==eQBG || _m_QheurTypeFirstTS==eQPOMDP))
        throw(E("QHybrid can only use QBG or QPOMDP for the first time steps"));

    // first we need to compute for how many JAOHs we will store Qvalues
    size_t nr=0;
    for(Index t=0; t<_m_horizonFirstTimeSteps ;++t)
    {
        size_t nrT=1; //the number of histories at 
        for (Index aI=0 ; aI<GetPU()->GetNrAgents(); ++aI)
        {
            size_t historiesThisAgent =  
                GetPU()->GetNrObservationHistories(aI,t) *  
                GetPU()->GetNrActionHistories(aI,t);
            nrT *= historiesThisAgent;
        }
        nr += nrT;
    }
    _m_nrJAOHinFirstTS=nr;

    _m_QValuesFirstTimeSteps.resize(_m_nrJAOHinFirstTS,
                                    GetPU()->GetNrJointActions(),
                                    false);
    _m_QValuesFirstTimeSteps.SetToZero();
    _m_initialized = true;
 
    cout << SoftPrintBrief() << " with " << _m_nrJAOHinFirstTS << " JAOH in tree ("
         << _m_horizonFirstTimeSteps << " ts), and";
    cout << " vectors for " << _m_horizonLastTimeSteps << " ts."
         << endl; 
}